

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O3

bool Inferences::anon_unknown_1::isIntegerComparisonLiteral(Literal *lit)

{
  bool bVar1;
  int iVar2;
  Interpretation IVar3;
  uint uVar4;
  Literal *pLVar5;
  
  iVar2 = 0;
  pLVar5 = lit;
  if (*(int *)&(lit->super_Term).field_0xc < 0) {
    iVar2 = 0;
    do {
      pLVar5 = *(Literal **)&(pLVar5->super_Term).field_9._vars;
      if (((ulong)pLVar5 & 1) != 0) {
        uVar4 = 3;
        goto LAB_004e96c6;
      }
      iVar2 = iVar2 + 2;
    } while (*(int *)&(pLVar5->super_Term).field_0xc < 0);
  }
  uVar4 = (pLVar5->super_Term).field_9._vars;
LAB_004e96c6:
  if ((iVar2 + uVar4 == 0) &&
     (bVar1 = Kernel::Theory::isInterpretedPredicate((Theory *)Kernel::theory,lit), bVar1)) {
    IVar3 = Kernel::Theory::interpretPredicate((Theory *)Kernel::theory,lit);
    return IVar3 == INT_LESS;
  }
  return false;
}

Assistant:

bool isIntegerComparisonLiteral(Literal* lit) {
  if (!lit->ground() || !theory->isInterpretedPredicate(lit)) return false;
  switch (theory->interpretPredicate(lit)) {
    case Theory::INT_LESS:
      // The only supported integer comparison predicate is INT_LESS.
      break;
    case Theory::INT_LESS_EQUAL:
    case Theory::INT_GREATER_EQUAL:
    case Theory::INT_GREATER:
      // All formulas should be normalized to only use INT_LESS and not other integer comparison predicates.

      // Equality proxy may generate useless congruence axioms for the likes of INT_GREATER
      // (although they only appeared in the input and are eliminated by now -> but this also means they are safe to ingore)
      ASS_EQ(env.options->equalityProxy(),Options::EqualityProxy::RSTC);
    default:
      // Not an integer comparison.
      return false;
  }
  return true;
}